

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Iscatterv(void *sendbuf,int *sendcounts,int *displs,MPIABI_Datatype sendtype,
                    void *recvbuf,int recvcount,MPIABI_Datatype recvtype,int root,MPIABI_Comm comm,
                    MPIABI_Request *request)

{
  int iVar1;
  
  iVar1 = MPI_Iscatterv();
  return iVar1;
}

Assistant:

int MPIABI_Iscatterv(
  const void * sendbuf,
  const int * sendcounts,
  const int * displs,
  MPIABI_Datatype sendtype,
  void * recvbuf,
  int recvcount,
  MPIABI_Datatype recvtype,
  int root,
  MPIABI_Comm comm,
  MPIABI_Request * request
) {
  return MPI_Iscatterv(
    sendbuf,
    sendcounts,
    displs,
    (MPI_Datatype)(WPI_Datatype)sendtype,
    recvbuf,
    recvcount,
    (MPI_Datatype)(WPI_Datatype)recvtype,
    root,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Request *)(WPI_RequestPtr)request
  );
}